

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  int iVar1;
  Iterator *data_iter;
  long in_FS_OFFSET;
  Slice handle;
  Slice local_40;
  Slice local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->index_iter_).valid_ == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      SetDataIterator(this,(Iterator *)0x0);
      return;
    }
    goto LAB_0054577f;
  }
  local_30 = IteratorWrapper::value(&this->index_iter_);
  if ((this->data_iter_).iter_ == (Iterator *)0x0) {
LAB_0054570e:
    data_iter = (*this->block_function_)(this->arg_,&this->options_,&local_30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&this->data_block_handle_,local_30.data_,local_30.size_);
    SetDataIterator(this,data_iter);
  }
  else {
    local_40.data_ = (this->data_block_handle_)._M_dataplus._M_p;
    local_40.size_ = (this->data_block_handle_)._M_string_length;
    iVar1 = Slice::compare(&local_30,&local_40);
    if (iVar1 != 0) goto LAB_0054570e;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0054577f:
  __stack_chk_fail();
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}